

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

HeapAndPointer __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::getHeapAndAdjustedPointer(unsigned_int,wasm::Expression__unsigned_int_
          (void *this,Index bytes,Expression *ptr,Index offset)

{
  Address offset_00;
  Ref ptr_00;
  int shifts;
  void *__ptr;
  char *pcVar1;
  char *pcVar2;
  HeapAndPointer HVar3;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  ptr_00 = makePointer(wasm::Expression*,wasm::Address_(this,ptr,offset_00);
  if (bytes == 4) {
    shifts = 2;
    pcVar1 = cashew::HEAP16;
    pcVar2 = cashew::HEAP32;
  }
  else {
    if (bytes != 2) {
      pcVar1 = cashew::HEAPF64;
      pcVar2 = cashew::HEAP8;
      if (bytes != 1) {
        ::wasm::handle_unreachable
                  ("unimp",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                   ,0x811);
      }
      goto LAB_00148410;
    }
    shifts = 1;
    pcVar1 = __stringstream;
    pcVar2 = cashew::HEAP16;
  }
  ptr_00 = cashew::ValueBuilder::makePtrShift(ptr_00,shifts);
LAB_00148410:
  __ptr = (void *)0x18;
  HVar3.heap.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  (HVar3.heap.inst)->type = Null;
  cashew::Value::free(HVar3.heap.inst,__ptr);
  (HVar3.heap.inst)->type = String;
  ((HVar3.heap.inst)->field_1).str.str._M_len = (size_t)pcVar2;
  ((HVar3.heap.inst)->field_1).str.str._M_str = pcVar1;
  HVar3.ptr.inst = ptr_00.inst;
  return HVar3;
}

Assistant:

HeapAndPointer
    getHeapAndAdjustedPointer(Index bytes, Expression* ptr, Index offset) {
      IString heap;
      Ref adjustedPtr = makePointer(ptr, offset);
      switch (bytes) {
        case 1:
          heap = HEAP8;
          break;
        case 2:
          heap = HEAP16;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 1);
          break;
        case 4:
          heap = HEAP32;
          adjustedPtr = ValueBuilder::makePtrShift(adjustedPtr, 2);
          break;
        default: {
          WASM_UNREACHABLE("unimp");
        }
      }
      return {ValueBuilder::makeName(heap), adjustedPtr};
    }